

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

HighsInt __thiscall HighsSymmetryDetection::getOrbit(HighsSymmetryDetection *this,HighsInt vertex)

{
  int *piVar1;
  iterator __position;
  pointer piVar2;
  uint uVar3;
  pointer piVar4;
  ulong uVar5;
  pointer piVar6;
  ulong uVar7;
  HighsInt i;
  int local_24;
  
  uVar5 = (ulong)(this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[vertex];
  piVar4 = (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = piVar4[uVar5];
  uVar7 = (ulong)(int)uVar3;
  if (uVar3 != piVar4[uVar7]) {
    do {
      __position._M_current =
           (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->linkCompressionStack,__position,
                   &local_24);
        piVar4 = (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        *__position._M_current = (int)uVar5;
        (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar3 = piVar4[(int)uVar7];
      uVar5 = uVar7 & 0xffffffff;
      uVar7 = (ulong)uVar3;
    } while (uVar3 != piVar4[(int)uVar3]);
    piVar2 = (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      piVar1 = piVar6 + -1;
      piVar6 = piVar6 + -1;
      piVar4[*piVar1] = uVar3;
    } while (piVar6 != piVar2);
    (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar6;
  }
  return uVar3;
}

Assistant:

HighsInt HighsSymmetryDetection::getOrbit(HighsInt vertex) {
  HighsInt i = vertexPosition[vertex];
  HighsInt orbit = orbitPartition[i];
  if (orbit != orbitPartition[orbit]) {
    do {
      linkCompressionStack.push_back(i);
      i = orbit;
      orbit = orbitPartition[orbit];
    } while (orbit != orbitPartition[orbit]);

    do {
      i = linkCompressionStack.back();
      linkCompressionStack.pop_back();
      orbitPartition[i] = orbit;
    } while (!linkCompressionStack.empty());
  }

  return orbit;
}